

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
          (BasicProblem<mp::BasicProblemParams<int>_> *this)

{
  (this->super_ExprFactory)._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_001867b8;
  (this->super_ExprFactory).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ExprFactory).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ExprFactory).exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ExprFactory).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ExprFactory).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ExprFactory).funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SuffixManager::SuffixManager(&this->super_SuffixManager);
  (this->super_ExprFactory)._vptr_BasicExprFactory = (_func_int **)&PTR__BasicProblem_00186778;
  (this->super_SuffixManager)._vptr_SuffixManager = (_func_int **)&PTR__BasicProblem_00186798;
  (this->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->var_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->var_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->var_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->con_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->con_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->con_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->obj_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obj_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obj_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vars_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vars_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vars_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->vars_).
           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (this->is_var_int_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->nonlinear_cons_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->nonlinear_cons_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nonlinear_cons_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->algebraic_cons_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->algebraic_cons_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->algebraic_cons_).
  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  memset(&(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage,0,0xe0);
  return;
}

Assistant:

BasicProblem() {}